

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

void anon_unknown.dwarf_41187::writeSymbolMap(Module *wasm,string *filename)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  allocator<char> local_2a9;
  string local_2a8 [48];
  PassOptions local_278;
  PassRunner local_1c0 [8];
  PassRunner runner;
  undefined1 local_d0 [8];
  PassOptions options;
  string *filename_local;
  Module *wasm_local;
  
  options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)filename;
  ::wasm::PassOptions::PassOptions((PassOptions *)local_d0);
  ::wasm::PassOptions::PassOptions(&local_278,(PassOptions *)local_d0);
  ::wasm::PassRunner::PassRunner(local_1c0,wasm,&local_278);
  ::wasm::PassOptions::~PassOptions(&local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"symbolmap",&local_2a9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_2d8,filename);
  ::wasm::PassRunner::add(local_1c0,local_2a8,&local_2d8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2d8);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  ::wasm::PassRunner::run();
  ::wasm::PassRunner::~PassRunner(local_1c0);
  ::wasm::PassOptions::~PassOptions((PassOptions *)local_d0);
  return;
}

Assistant:

void writeSymbolMap(Module& wasm, std::string filename) {
  PassOptions options;
  PassRunner runner(&wasm, options);
  runner.add("symbolmap", filename);
  runner.run();
}